

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_trie.c
# Opt level: O0

trie_node trie_node_find(trie t,trie_key key)

{
  int iVar1;
  vector v;
  size_t sVar2;
  long *plVar3;
  vector v_00;
  long in_RSI;
  long in_RDI;
  trie_node current_node;
  trie_node_ref ref_node;
  set_iterator it;
  trie_node back;
  trie_node *back_ptr;
  vector node_stack;
  set in_stack_ffffffffffffffb8;
  vector in_stack_ffffffffffffffc0;
  set_iterator local_38;
  trie_node local_8;
  
  if ((in_RDI == 0) || (in_RSI == 0)) {
LAB_0011e1a2:
    local_8 = (trie_node)0x0;
  }
  else {
    v = vector_create(0x11e050);
    vector_push_back(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    do {
      do {
        sVar2 = vector_size(v);
        if (sVar2 == 0) {
          vector_destroy((vector)0x11e1a2);
          goto LAB_0011e1a2;
        }
        plVar3 = (long *)vector_back((vector)in_stack_ffffffffffffffb8);
        vector_pop_back((vector)0x11e091);
      } while ((plVar3 == (long *)0x0) || (*plVar3 == 0));
      local_8 = (trie_node)*plVar3;
      local_38 = (set_iterator)0x0;
      if (local_8->childs != (set)0x0) {
        local_38 = set_iterator_begin(in_stack_ffffffffffffffb8);
        while (iVar1 = set_iterator_end((set_iterator *)in_stack_ffffffffffffffb8), 0 < iVar1) {
          v_00 = (vector)set_iterator_get_value(local_38);
          in_stack_ffffffffffffffb8 = (set)(*(long *)(in_RDI + 8) + v_00->capacity * 0x28);
          vector_push_back(v_00,in_stack_ffffffffffffffb8);
          set_iterator_next(local_38);
        }
      }
    } while ((local_8->key == (trie_key)0x0) ||
            (iVar1 = (**(code **)(in_RDI + 0x40))(local_8->key,in_RSI), iVar1 != 0));
    while (iVar1 = set_iterator_end((set_iterator *)in_stack_ffffffffffffffb8), 0 < iVar1) {
      set_iterator_next(local_38);
    }
    vector_destroy((vector)0x11e185);
  }
  return local_8;
}

Assistant:

trie_node trie_node_find(trie t, trie_key key)
{
	if (t != NULL && key != NULL)
	{
		vector node_stack = vector_create(sizeof(trie_node));

		vector_push_back(node_stack, &t->root);

		while (vector_size(node_stack) > 0)
		{
			trie_node *back_ptr = vector_back(node_stack);

			vector_pop_back(node_stack);

			if (back_ptr != NULL && *back_ptr != NULL)
			{
				trie_node back = *back_ptr;

				set_iterator it = NULL;

				if (back->childs != NULL)
				{
					for (it = set_iterator_begin(back->childs); set_iterator_end(&it) > 0; set_iterator_next(it))
					{
						trie_node_ref ref_node = set_iterator_get_value(it);

						trie_node current_node = &t->node_list[ref_node->index];

						vector_push_back(node_stack, &current_node);
					}
				}

				if (back->key != NULL && t->compare_cb(back->key, key) == 0)
				{
					while (set_iterator_end(&it) > 0)
					{
						set_iterator_next(it);
					}

					vector_destroy(node_stack);

					return back;
				}
			}
		}

		vector_destroy(node_stack);
	}

	return NULL;
}